

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O2

double __thiscall biosoup::Timer::Stop(Timer *this)

{
  long lVar1;
  double dVar2;
  
  if ((this->checkpoint_).__d.__r != 0) {
    lVar1 = std::chrono::_V2::steady_clock::now();
    dVar2 = (double)(lVar1 - (this->checkpoint_).__d.__r) / 1000000000.0;
    (this->checkpoint_).__d.__r = 0;
    this->elapsed_time_ = this->elapsed_time_ + dVar2;
    return dVar2;
  }
  return 0.0;
}

Assistant:

double Stop() {
    if (checkpoint_.time_since_epoch().count()) {  // Start() was called
      auto duration = std::chrono::duration_cast<std::chrono::duration<double>>(
          std::chrono::steady_clock::now() - checkpoint_).count();
      checkpoint_ = {};
      elapsed_time_ += duration;
      return duration;
    }
    return 0;
  }